

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O0

base_uint<256U> * __thiscall base_uint<256U>::operator+=(base_uint<256U> *this,base_uint<256U> *b)

{
  long lVar1;
  long in_RSI;
  base_uint<256U> *in_RDI;
  long in_FS_OFFSET;
  uint64_t n;
  int i;
  uint64_t carry;
  int local_24;
  ulong local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0;
  for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
    local_20 = local_20 + in_RDI->pn[local_24] + (ulong)*(uint *)(in_RSI + (long)local_24 * 4);
    in_RDI->pn[local_24] = (uint32_t)local_20;
    local_20 = local_20 >> 0x20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator+=(const base_uint& b)
    {
        uint64_t carry = 0;
        for (int i = 0; i < WIDTH; i++)
        {
            uint64_t n = carry + pn[i] + b.pn[i];
            pn[i] = n & 0xffffffff;
            carry = n >> 32;
        }
        return *this;
    }